

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kcpu.h
# Opt level: O0

void m68ki_stack_frame_1000(uint pc,uint sr,uint vector)

{
  uint vector_local;
  uint sr_local;
  uint pc_local;
  
  m68ki_fake_push_32();
  m68ki_fake_push_32();
  m68ki_fake_push_32();
  m68ki_fake_push_32();
  m68ki_fake_push_32();
  m68ki_fake_push_32();
  m68ki_fake_push_32();
  m68ki_fake_push_32();
  m68ki_push_16(0);
  m68ki_fake_push_16();
  m68ki_push_16(0);
  m68ki_fake_push_16();
  m68ki_push_16(0);
  m68ki_fake_push_16();
  m68ki_push_32(0);
  m68ki_push_16(0);
  m68ki_push_16(vector << 2 | 0x8000);
  m68ki_push_32(pc);
  m68ki_push_16(sr);
  return;
}

Assistant:

static inline void m68ki_stack_frame_1000(uint pc, uint sr, uint vector)
{
	/* VERSION
	 * NUMBER
	 * INTERNAL INFORMATION, 16 WORDS
	 */
	m68ki_fake_push_32();
	m68ki_fake_push_32();
	m68ki_fake_push_32();
	m68ki_fake_push_32();
	m68ki_fake_push_32();
	m68ki_fake_push_32();
	m68ki_fake_push_32();
	m68ki_fake_push_32();

	/* INSTRUCTION INPUT BUFFER */
	m68ki_push_16(0);

	/* UNUSED, RESERVED (not written) */
	m68ki_fake_push_16();

	/* DATA INPUT BUFFER */
	m68ki_push_16(0);

	/* UNUSED, RESERVED (not written) */
	m68ki_fake_push_16();

	/* DATA OUTPUT BUFFER */
	m68ki_push_16(0);

	/* UNUSED, RESERVED (not written) */
	m68ki_fake_push_16();

	/* FAULT ADDRESS */
	m68ki_push_32(0);

	/* SPECIAL STATUS WORD */
	m68ki_push_16(0);

	/* 1000, VECTOR OFFSET */
	m68ki_push_16(0x8000 | (vector<<2));

	/* PROGRAM COUNTER */
	m68ki_push_32(pc);

	/* STATUS REGISTER */
	m68ki_push_16(sr);
}